

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::compileDefaultDefaultValue
          (NodeTranslator *this,Reader type,Builder target)

{
  OrphanBuilder local_48;
  PointerBuilder local_28;
  
  if (type._reader.dataSize < 0x10) {
switchD_0016c775_caseD_0:
    *(undefined2 *)target._builder.data = 0;
    return;
  }
  switch(*type._reader.data) {
  case 0:
    goto switchD_0016c775_caseD_0;
  case 1:
    *(undefined2 *)target._builder.data = 1;
    *(byte *)((long)target._builder.data + 2) = *(byte *)((long)target._builder.data + 2) & 0xfe;
    break;
  case 2:
    *(undefined2 *)target._builder.data = 2;
    goto LAB_0016c8ab;
  case 3:
    *(undefined4 *)target._builder.data = 3;
    break;
  case 4:
    *(undefined2 *)target._builder.data = 4;
    goto LAB_0016c8ec;
  case 5:
    *(undefined2 *)target._builder.data = 5;
    goto LAB_0016c84e;
  case 6:
    *(undefined2 *)target._builder.data = 6;
LAB_0016c8ab:
    *(undefined1 *)((long)target._builder.data + 2) = 0;
    break;
  case 7:
    *(undefined4 *)target._builder.data = 7;
    break;
  case 8:
    *(undefined2 *)target._builder.data = 8;
    goto LAB_0016c8ec;
  case 9:
    *(undefined2 *)target._builder.data = 9;
    goto LAB_0016c84e;
  case 10:
    *(undefined2 *)target._builder.data = 10;
LAB_0016c8ec:
    *(undefined4 *)((long)target._builder.data + 4) = 0;
    break;
  case 0xb:
    *(undefined2 *)target._builder.data = 0xb;
LAB_0016c84e:
    *(undefined8 *)((long)target._builder.data + 8) = 0;
    break;
  case 0xc:
    local_48.capTable = (CapTableBuilder *)0x0;
    local_48.location = (word *)0x0;
    local_48.tag.content = 0;
    local_48.segment = (SegmentBuilder *)0x0;
    *(undefined2 *)target._builder.data = 0xc;
    local_28.segment = target._builder.segment;
    local_28.capTable = target._builder.capTable;
    local_28.pointer = target._builder.pointers;
    _::PointerBuilder::adopt(&local_28,&local_48);
    goto LAB_0016c889;
  case 0xd:
    local_48.capTable = (CapTableBuilder *)0x0;
    local_48.location = (word *)0x0;
    local_48.tag.content = 0;
    local_48.segment = (SegmentBuilder *)0x0;
    *(undefined2 *)target._builder.data = 0xd;
    local_28.segment = target._builder.segment;
    local_28.capTable = target._builder.capTable;
    local_28.pointer = target._builder.pointers;
    _::PointerBuilder::adopt(&local_28,&local_48);
LAB_0016c889:
    if (local_48.segment != (SegmentBuilder *)0x0) {
      _::OrphanBuilder::euthanize(&local_48);
    }
    break;
  case 0xe:
    *(undefined2 *)target._builder.data = 0xe;
    goto LAB_0016c8bd;
  case 0xf:
    *(undefined4 *)target._builder.data = 0xf;
    break;
  case 0x10:
    *(undefined2 *)target._builder.data = 0x10;
    goto LAB_0016c8bd;
  case 0x11:
    *(undefined2 *)target._builder.data = 0x11;
    break;
  case 0x12:
    *(undefined2 *)target._builder.data = 0x12;
LAB_0016c8bd:
    local_48.tag.content = (uint64_t)target._builder.segment;
    local_48.segment = (SegmentBuilder *)target._builder.capTable;
    local_48.capTable = (CapTableBuilder *)target._builder.pointers;
    _::PointerBuilder::clear((PointerBuilder *)&local_48);
  }
  return;
}

Assistant:

void NodeTranslator::compileDefaultDefaultValue(
    schema::Type::Reader type, schema::Value::Builder target) {
  switch (type.which()) {
    case schema::Type::VOID: target.setVoid(); break;
    case schema::Type::BOOL: target.setBool(false); break;
    case schema::Type::INT8: target.setInt8(0); break;
    case schema::Type::INT16: target.setInt16(0); break;
    case schema::Type::INT32: target.setInt32(0); break;
    case schema::Type::INT64: target.setInt64(0); break;
    case schema::Type::UINT8: target.setUint8(0); break;
    case schema::Type::UINT16: target.setUint16(0); break;
    case schema::Type::UINT32: target.setUint32(0); break;
    case schema::Type::UINT64: target.setUint64(0); break;
    case schema::Type::FLOAT32: target.setFloat32(0); break;
    case schema::Type::FLOAT64: target.setFloat64(0); break;
    case schema::Type::ENUM: target.setEnum(0); break;
    case schema::Type::INTERFACE: target.setInterface(); break;

    // Bit of a hack:  For Text/Data, we adopt a null orphan, which sets the field to null.
    // TODO(cleanup):  Create a cleaner way to do this.
    case schema::Type::TEXT: target.adoptText(Orphan<Text>()); break;
    case schema::Type::DATA: target.adoptData(Orphan<Data>()); break;
    case schema::Type::STRUCT: target.initStruct(); break;
    case schema::Type::LIST: target.initList(); break;
    case schema::Type::ANY_POINTER: target.initAnyPointer(); break;
  }
}